

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

void __thiscall FNodeBuilder::AddPolySegs(FNodeBuilder *this,FPolySeg *segs,int numsegs)

{
  DWORD DVar1;
  DWORD DVar2;
  uint uVar3;
  long *plVar4;
  long lVar5;
  FPrivVert *pFVar6;
  line_t_conflict *plVar7;
  side_t *psVar8;
  FPrivSeg *pFVar9;
  FPrivSeg *pFVar10;
  FPolySeg *pFVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  FPrivVert vert;
  undefined4 local_68;
  undefined4 local_64;
  long local_58;
  TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg> *local_50;
  FPolySeg *local_48;
  sector_t_conflict *local_40;
  sector_t_conflict *local_38;
  
  if (numsegs < 1) {
    __assert_fail("numsegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/nodebuild_utility.cpp"
                  ,0xf4,"void FNodeBuilder::AddPolySegs(FPolySeg *, int)");
  }
  local_50 = &this->Segs;
  local_58 = (ulong)(uint)numsegs * 0x28;
  lVar14 = 0;
  local_48 = segs;
  do {
    pFVar11 = local_48;
    plVar4 = *(long **)((long)&local_48->wall + lVar14);
    if (plVar4 == (long *)0x0) {
      __assert_fail("side != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/nodebuild_utility.cpp"
                    ,0x105,"void FNodeBuilder::AddPolySegs(FPolySeg *, int)");
    }
    local_38 = (sector_t_conflict *)*plVar4;
    local_40 = *(sector_t_conflict **)(plVar4[0x14] + 0x78);
    if (local_40 == local_38) {
      local_40 = *(sector_t_conflict **)(plVar4[0x14] + 0x80);
    }
    local_68 = SUB84(*(double *)((long)&(local_48->v1).pos.X + lVar14) + 103079215104.0,0);
    local_64 = SUB84(*(double *)((long)&(local_48->v1).pos.Y + lVar14) + 103079215104.0,0);
    iVar12 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,&local_68);
    local_68 = SUB84(*(double *)((long)&(pFVar11->v2).pos.X + lVar14) + 103079215104.0,0);
    local_64 = SUB84(*(double *)((long)&(pFVar11->v2).pos.Y + lVar14) + 103079215104.0,0);
    iVar13 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,&local_68);
    lVar5 = plVar4[0x14];
    pFVar6 = (this->Vertices).Array;
    plVar7 = this->Level->Lines;
    psVar8 = this->Level->Sides;
    DVar1 = pFVar6[iVar12].segs;
    DVar2 = pFVar6[iVar13].segs2;
    TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Grow(local_50,1);
    pFVar9 = (this->Segs).Array;
    uVar3 = (this->Segs).Count;
    pFVar9[uVar3].v1 = iVar12;
    pFVar9[uVar3].v2 = iVar13;
    pFVar9[uVar3].sidedef = (int)((ulong)((long)plVar4 - (long)psVar8) >> 6) * -0x55555555;
    pFVar9[uVar3].linedef = (int)((ulong)(lVar5 - (long)plVar7) >> 3) * 0x286bca1b;
    pFVar9[uVar3].frontsector = local_38;
    pFVar9[uVar3].backsector = local_40;
    pFVar9[uVar3].next = 0xffffffff;
    pFVar9[uVar3].nextforvert = DVar1;
    pFVar9[uVar3].nextforvert2 = DVar2;
    pFVar10 = pFVar9 + uVar3;
    pFVar10->loopnum = 0;
    pFVar10->partner = 0xffffffff;
    *(undefined8 *)(&pFVar10->loopnum + 2) = 0xffffffffffffffff;
    pFVar9[uVar3].planefront = false;
    pFVar9[uVar3].hashnext = (FPrivSeg *)0x0;
    uVar3 = (this->Segs).Count;
    (this->Segs).Count = uVar3 + 1;
    pFVar6 = (this->Vertices).Array;
    pFVar6[iVar12].segs = uVar3;
    pFVar6[iVar13].segs2 = uVar3;
    lVar14 = lVar14 + 0x28;
  } while (local_58 != lVar14);
  return;
}

Assistant:

void FNodeBuilder::AddPolySegs(FPolySeg *segs, int numsegs)
{
	assert(numsegs > 0);

	for (int i = 0; i < numsegs; ++i)
	{
		FPrivSeg seg;
		FPrivVert vert;
		int segnum;

		seg.next = DWORD_MAX;
		seg.loopnum = 0;
		seg.partner = DWORD_MAX;
		seg.hashnext = NULL;
		seg.planefront = false;
		seg.planenum = DWORD_MAX;
		seg.storedseg = DWORD_MAX;

		side_t *side = segs[i].wall;
		assert(side != NULL);

		seg.frontsector = side->sector;
		seg.backsector = side->linedef->frontsector == side->sector ? side->linedef->backsector : side->linedef->frontsector;
		vert.x = FLOAT2FIXED(segs[i].v1.pos.X);
		vert.y = FLOAT2FIXED(segs[i].v1.pos.Y);
		seg.v1 = VertexMap->SelectVertexExact(vert);
		vert.x = FLOAT2FIXED(segs[i].v2.pos.X);
		vert.y = FLOAT2FIXED(segs[i].v2.pos.Y);
		seg.v2 = VertexMap->SelectVertexExact(vert);
		seg.linedef = int(side->linedef - Level.Lines);
		seg.sidedef = int(side - Level.Sides);
		seg.nextforvert = Vertices[seg.v1].segs;
		seg.nextforvert2 = Vertices[seg.v2].segs2;

		segnum = (int)Segs.Push(seg);
		Vertices[seg.v1].segs = segnum;
		Vertices[seg.v2].segs2 = segnum;
	}
}